

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_command_resp(Curl_easy *data,int pop3code,pop3state instate)

{
  connectdata *pcVar1;
  IMAP *pIVar2;
  char *str;
  size_t nread;
  pingpong *pp;
  pop3_conn *pop3c;
  POP3 *pop3;
  connectdata *conn;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  pcVar1 = data->conn;
  pIVar2 = (data->req).p.imap;
  if (pop3code == 0x2b) {
    (pcVar1->proto).pop3c.eob = 2;
    (pcVar1->proto).pop3c.strip = 2;
    if (pIVar2->transfer == PPTRANSFER_BODY) {
      Curl_xfer_setup1(data,1,-1,false);
      if ((pcVar1->proto).ftpc.pp.overflow != 0) {
        Curl_dyn_tail(&(pcVar1->proto).ftpc.pp.recvbuf,(pcVar1->proto).ftpc.pp.overflow);
        (pcVar1->proto).ftpc.pp.nfinal = 0;
        if ((*(uint *)&(data->req).field_0xd9 >> 0x11 & 1) == 0) {
          str = Curl_dyn_ptr(&(pcVar1->proto).ftpc.pp.recvbuf);
          nread = Curl_dyn_len(&(pcVar1->proto).ftpc.pp.recvbuf);
          conn._4_4_ = pop3_write(data,str,nread,false);
          if (conn._4_4_ != CURLE_OK) {
            return conn._4_4_;
          }
        }
        Curl_dyn_reset(&(pcVar1->proto).ftpc.pp.recvbuf);
        (pcVar1->proto).ftpc.pp.overflow = 0;
      }
    }
    else {
      (pcVar1->proto).ftpc.pp.overflow = 0;
    }
    pop3_state(data,POP3_STOP);
    data_local._4_4_ = conn._4_4_;
  }
  else {
    pop3_state(data,POP3_STOP);
    data_local._4_4_ = CURLE_WEIRD_SERVER_REPLY;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode pop3_state_command_resp(struct Curl_easy *data,
                                        int pop3code,
                                        pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct POP3 *pop3 = data->req.p.pop3;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;

  (void)instate; /* no use for this yet */

  if(pop3code != '+') {
    pop3_state(data, POP3_STOP);
    return CURLE_WEIRD_SERVER_REPLY;
  }

  /* This 'OK' line ends with a CR LF pair which is the two first bytes of the
     EOB string so count this is two matching bytes. This is necessary to make
     the code detect the EOB if the only data than comes now is %2e CR LF like
     when there is no body to return. */
  pop3c->eob = 2;

  /* But since this initial CR LF pair is not part of the actual body, we set
     the strip counter here so that these bytes will not be delivered. */
  pop3c->strip = 2;

  if(pop3->transfer == PPTRANSFER_BODY) {
    /* POP3 download */
    Curl_xfer_setup1(data, CURL_XFER_RECV, -1, FALSE);

    if(pp->overflow) {
      /* The recv buffer contains data that is actually body content so send
         it as such. Note that there may even be additional "headers" after
         the body */

      /* keep only the overflow */
      Curl_dyn_tail(&pp->recvbuf, pp->overflow);
      pp->nfinal = 0; /* done */

      if(!data->req.no_body) {
        result = pop3_write(data, Curl_dyn_ptr(&pp->recvbuf),
                            Curl_dyn_len(&pp->recvbuf), FALSE);
        if(result)
          return result;
      }

      /* reset the buffer */
      Curl_dyn_reset(&pp->recvbuf);
      pp->overflow = 0;
    }
  }
  else
    pp->overflow = 0;

  /* End of DO phase */
  pop3_state(data, POP3_STOP);

  return result;
}